

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O3

bool __thiscall
testing::internal::
TypedExpectation<BasicTestExpr<2>_(mp::expr::Kind,_BasicTestExpr<1>,_BasicTestExpr<1>)>::Matches
          (TypedExpectation<BasicTestExpr<2>_(mp::expr::Kind,_BasicTestExpr<1>,_BasicTestExpr<1>)>
           *this,ArgumentTuple *args)

{
  MatcherInterface<const_std::tuple<mp::expr::Kind,_BasicTestExpr<1>,_BasicTestExpr<1>_>_&> *pMVar1;
  bool bVar2;
  undefined1 uVar3;
  int iVar4;
  
  MutexBase::AssertHeld((MutexBase *)g_gmock_mutex);
  bVar2 = TuplePrefix<3ul>::
          Matches<std::tuple<testing::Matcher<mp::expr::Kind>,testing::Matcher<BasicTestExpr<1>>,testing::Matcher<BasicTestExpr<1>>>,std::tuple<mp::expr::Kind,BasicTestExpr<1>,BasicTestExpr<1>>>
                    (&this->matchers_,args);
  if (bVar2) {
    pMVar1 = (this->extra_matcher_).
             super_MatcherBase<const_std::tuple<mp::expr::Kind,_BasicTestExpr<1>,_BasicTestExpr<1>_>_&>
             .impl_.value_;
    iVar4 = (*(pMVar1->super_MatcherDescriberInterface)._vptr_MatcherDescriberInterface[4])
                      (pMVar1,args);
    uVar3 = (undefined1)iVar4;
  }
  else {
    uVar3 = 0;
  }
  return (bool)uVar3;
}

Assistant:

GTEST_EXCLUSIVE_LOCK_REQUIRED_(g_gmock_mutex) {
    g_gmock_mutex.AssertHeld();
    return TupleMatches(matchers_, args) && extra_matcher_.Matches(args);
  }